

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pool.cpp
# Opt level: O2

void __thiscall
cppcms::session_pool::backend
          (session_pool *this,
          unique_ptr<cppcms::session_api_factory,_std::default_delete<cppcms::session_api_factory>_>
          *b)

{
  std::
  __uniq_ptr_impl<cppcms::session_api_factory,_std::default_delete<cppcms::session_api_factory>_>::
  operator=((__uniq_ptr_impl<cppcms::session_api_factory,_std::default_delete<cppcms::session_api_factory>_>
             *)&this->backend_,
            (__uniq_ptr_impl<cppcms::session_api_factory,_std::default_delete<cppcms::session_api_factory>_>
             *)b);
  return;
}

Assistant:

void session_pool::backend(std::unique_ptr<session_api_factory> b)
{
	backend_=std::move(b);
}